

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

_Bool upb_Array_Insert(upb_Array *arr,size_t i,size_t count,upb_Arena *arena)

{
  ulong uVar1;
  uint __line;
  _Bool _Var2;
  char *__assertion;
  
  if ((arr->data_dont_copy_me__upb_internal_use_only & 4) == 0) {
    if (arena == (upb_Arena *)0x0) {
      __assertion = "arena";
      __line = 0x4e;
    }
    else {
      uVar1 = arr->size_dont_copy_me__upb_internal_use_only;
      if (uVar1 < i) {
        __assertion = "i <= arr->size_dont_copy_me__upb_internal_use_only";
        __line = 0x4f;
      }
      else {
        if (!CARRY8(uVar1,count)) {
          _Var2 = _upb_Array_ResizeUninitialized_dont_copy_me__upb_internal_use_only
                            (arr,uVar1 + count,arena);
          if (_Var2) {
            upb_Array_Move(arr,count + i,i,uVar1 - i);
          }
          return _Var2;
        }
        __assertion = "count + arr->size_dont_copy_me__upb_internal_use_only >= count";
        __line = 0x50;
      }
    }
  }
  else {
    __assertion = "!upb_Array_IsFrozen(arr)";
    __line = 0x4d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,__line,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
}

Assistant:

bool upb_Array_Insert(upb_Array* arr, size_t i, size_t count,
                      upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(arena);
  UPB_ASSERT(i <= arr->UPB_PRIVATE(size));
  UPB_ASSERT(count + arr->UPB_PRIVATE(size) >= count);
  const size_t oldsize = arr->UPB_PRIVATE(size);
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
          arr, arr->UPB_PRIVATE(size) + count, arena)) {
    return false;
  }
  upb_Array_Move(arr, i + count, i, oldsize - i);
  return true;
}